

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Scl_Item_t * Scl_LibertyReadPinTiming(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  Scl_Item_t *pSVar3;
  char *__s1;
  int *piVar4;
  
  piVar4 = &pPinOut->Child;
  do {
    pSVar2 = Scl_LibertyItem(p,*piVar4);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return (Scl_Item_t *)0x0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"timing");
    if (iVar1 == 0) {
      piVar4 = &pSVar2->Child;
      while (pSVar3 = Scl_LibertyItem(p,*piVar4), pSVar3 != (Scl_Item_t *)0x0) {
        iVar1 = Scl_LibertyCompare(p,pSVar3->Key,"related_pin");
        if (iVar1 == 0) {
          __s1 = Scl_LibertyReadString(p,pSVar3->Head);
          iVar1 = strcmp(__s1,pNameIn);
          if (iVar1 == 0) {
            return pSVar2;
          }
        }
        piVar4 = &pSVar3->Next;
      }
    }
    piVar4 = &pSVar2->Next;
  } while( true );
}

Assistant:

Scl_Item_t * Scl_LibertyReadPinTiming( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Scl_Item_t * pTiming, * pPinIn;
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                return pTiming;
    return NULL;
}